

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O1

ssize_t gzip_filter_read(archive_read_filter *self,void **p)

{
  uInt uVar1;
  z_streamp strm;
  z_streamp pzVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ssize_t sVar6;
  uLong uVar7;
  Bytef *pBVar8;
  ssize_t sVar9;
  void *pvVar10;
  long lVar11;
  char *pcVar12;
  archive_read *paVar13;
  ssize_t avail_in;
  ssize_t avail;
  uInt local_48;
  undefined4 uStack_44;
  uInt local_40;
  undefined4 uStack_3c;
  void **local_38;
  
  strm = (z_streamp)self->data;
  strm->next_out = *(Bytef **)&strm[1].avail_in;
  uVar1 = (uInt)strm[1].total_in;
  strm->avail_out = uVar1;
  local_38 = p;
  do {
    if ((uVar1 == 0) || ((char)strm[1].total_out != '\0')) goto LAB_0013460e;
    if (*(char *)&strm[1].next_in == '\0') {
      pzVar2 = (z_streamp)self->data;
      bVar3 = false;
      sVar6 = peek_at_header(self->upstream,(int *)0x0);
      if (sVar6 == 0) {
        sVar9 = 1;
      }
      else {
        __archive_read_filter_consume(self->upstream,sVar6);
        uVar7 = cm_zlib_crc32(0,(uchar *)0x0,0);
        *(uLong *)&pzVar2[1].avail_out = uVar7;
        pBVar8 = (Bytef *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_40);
        pzVar2->next_in = pBVar8;
        pzVar2->avail_in = local_40;
        uVar4 = cm_zlib_inflateInit2_(pzVar2,-0xf,"1.2.3",0x70);
        switch(uVar4) {
        case 0:
          *(undefined1 *)&pzVar2[1].next_in = 1;
          bVar3 = false;
          sVar9 = 0;
          goto LAB_001344de;
        case 0xfffffffa:
          paVar13 = self->archive;
          iVar5 = -1;
          pcVar12 = "Internal error initializing compression library: invalid library version";
          break;
        default:
          archive_set_error(&self->archive->archive,-1,
                            "Internal error initializing compression library:  Zlib error %d",
                            (ulong)uVar4);
          goto LAB_001344d5;
        case 0xfffffffc:
          paVar13 = self->archive;
          iVar5 = 0xc;
          pcVar12 = "Internal error initializing compression library: out of memory";
          break;
        case 0xfffffffe:
          paVar13 = self->archive;
          iVar5 = -1;
          pcVar12 = "Internal error initializing compression library: invalid setup parameter";
        }
        archive_set_error(&paVar13->archive,iVar5,pcVar12);
LAB_001344d5:
        sVar9 = -0x1e;
        bVar3 = true;
      }
LAB_001344de:
      if (sVar6 == 0) {
        *(undefined1 *)&strm[1].total_out = 1;
LAB_0013460e:
        pvVar10 = *(void **)&strm[1].avail_in;
        lVar11 = (long)strm->next_out - (long)pvVar10;
        strm[1].next_out = strm[1].next_out + lVar11;
        if (lVar11 == 0) {
          pvVar10 = (void *)0x0;
        }
        *local_38 = pvVar10;
        return lVar11;
      }
      if (bVar3) {
        return sVar9;
      }
    }
    pBVar8 = (Bytef *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_48);
    strm->next_in = pBVar8;
    if (pBVar8 == (Bytef *)0x0) {
      paVar13 = self->archive;
      pcVar12 = "truncated gzip input";
LAB_001345f1:
      archive_set_error(&paVar13->archive,-1,pcVar12);
      return -0x1e;
    }
    strm->avail_in = local_48;
    iVar5 = cm_zlib_inflate(strm,0);
    if (iVar5 == 1) {
      __archive_read_filter_consume
                (self->upstream,CONCAT44(uStack_44,local_48) - (ulong)strm->avail_in);
      pzVar2 = (z_streamp)self->data;
      *(undefined1 *)&pzVar2[1].next_in = 0;
      iVar5 = cm_zlib_inflateEnd(pzVar2);
      if (iVar5 == 0) {
        pvVar10 = __archive_read_filter_ahead(self->upstream,8,(ssize_t *)&local_40);
        sVar6 = -0x1e;
        bVar3 = true;
        if ((pvVar10 != (void *)0x0) && (CONCAT44(uStack_3c,local_40) != 0)) {
          __archive_read_filter_consume(self->upstream,8);
          bVar3 = false;
          sVar6 = 0;
        }
      }
      else {
        archive_set_error(&self->archive->archive,-1,"Failed to clean up gzip decompressor");
        sVar6 = -0x1e;
        bVar3 = true;
      }
      if (bVar3) {
        return sVar6;
      }
    }
    else {
      if (iVar5 != 0) {
        paVar13 = self->archive;
        pcVar12 = "gzip decompression failed";
        goto LAB_001345f1;
      }
      __archive_read_filter_consume
                (self->upstream,CONCAT44(uStack_44,local_48) - (ulong)strm->avail_in);
    }
    uVar1 = strm->avail_out;
  } while( true );
}

Assistant:

static ssize_t
gzip_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = (uInt)state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		/* If we're not in a stream, read a header
		 * and initialize the decompression library. */
		if (!state->in_stream) {
			ret = consume_header(self);
			if (ret == ARCHIVE_EOF) {
				state->eof = 1;
				break;
			}
			if (ret < ARCHIVE_OK)
				return (ret);
		}

		/* Peek at the next available data. */
		/* ZLib treats stream.next_in as const but doesn't declare
		 * it so, hence this ugly cast. */
		state->stream.next_in = (unsigned char *)(uintptr_t)
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated gzip input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = (uInt)avail_in;

		/* Decompress and consume some of that data. */
		ret = inflate(&(state->stream), 0);
		switch (ret) {
		case Z_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			break;
		case Z_STREAM_END: /* Found end of stream. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			/* Consume the stream trailer; release the
			 * decompression library. */
			ret = consume_trailer(self);
			if (ret < ARCHIVE_OK)
				return (ret);
			break;
		default:
			/* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "gzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}

	/* We've read as much as we can. */
	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}